

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p2pnet.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  float fVar1;
  float fVar2;
  char *pcVar3;
  int *piVar4;
  undefined1 auVar5 [16];
  char cVar6;
  pair<int,_int> pVar7;
  undefined8 *puVar8;
  undefined8 *puVar9;
  int i_2;
  undefined8 *puVar10;
  long lVar11;
  int i;
  uint uVar12;
  int iVar13;
  size_type __n;
  ulong uVar14;
  long lVar15;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  int iVar20;
  uint uVar21;
  ulong uVar22;
  bool bVar23;
  double dVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  Mat anchor_points;
  vector<int,_std::allocator<int>_> strides;
  Extractor ex;
  vector<float,_std::allocator<float>_> all_anchor_points;
  float norm_vals1 [3];
  Mat points;
  Mat score;
  vector<CrowdPoint,_std::allocator<CrowdPoint>_> crowd_points;
  vector<float,_std::allocator<float>_> shifted_anchor_points;
  vector<float,_std::allocator<float>_> anchor_points_1;
  float mean_vals1 [3];
  Mat in;
  vector<int,_std::allocator<int>_> pyramid_levels;
  Net net;
  Option opt;
  Mat bgr;
  value_type_conflict1 local_400;
  allocator_type local_3f9;
  undefined8 local_3f8;
  float fStack_3f0;
  float fStack_3ec;
  double local_3e8;
  vector<int,_std::allocator<int>_> local_3e0;
  Mat local_3c8;
  undefined1 local_378 [8];
  iterator iStack_370;
  int *local_368;
  undefined1 local_360 [24];
  undefined1 local_348 [16];
  undefined8 local_338;
  undefined8 local_328;
  undefined8 uStack_320;
  undefined1 local_318 [16];
  pair<int,_int> *local_308;
  Mat local_2f8;
  undefined1 local_2a8 [64];
  size_t local_268;
  undefined1 local_258 [16];
  pointer local_248;
  vector<float,_std::allocator<float>_> local_238;
  undefined1 local_218 [16];
  pointer local_208;
  vector<float,_std::allocator<float>_> local_200;
  void *local_1e8;
  undefined4 local_1e0;
  double local_1d0;
  Mat local_1c8;
  undefined1 local_178 [16];
  pointer local_168;
  Net local_158;
  int local_f8;
  int iStack_f4;
  int iStack_f0;
  int iStack_ec;
  undefined8 local_e8;
  undefined8 uStack_e0;
  Option local_d0;
  string local_90 [16];
  uchar *local_80;
  
  if (argc == 2) {
    pcVar3 = argv[1];
    std::__cxx11::string::string((string *)&local_158,pcVar3,(allocator *)&local_1c8);
    cv::imread(local_90,(int)&local_158);
    if ((Allocator **)local_158._vptr_Net != &local_158.opt.blob_allocator) {
      operator_delete(local_158._vptr_Net);
    }
    cVar6 = cv::Mat::empty();
    if (cVar6 == '\0') {
      local_258 = (undefined1  [16])0x0;
      local_248 = (pointer)0x0;
      ncnn::Option::Option(&local_d0);
      local_d0.num_threads = 4;
      local_d0.use_vulkan_compute = false;
      local_d0.use_bf16_storage = false;
      ncnn::Net::Net(&local_158);
      local_158.opt.num_threads = local_d0.num_threads;
      local_158.opt.lightmode = local_d0.lightmode;
      local_158.opt._1_3_ = local_d0._1_3_;
      local_158.opt.use_vulkan_compute = local_d0.use_vulkan_compute;
      local_158.opt.openmp_blocktime = local_d0.openmp_blocktime;
      local_158.opt.use_winograd_convolution = local_d0.use_winograd_convolution;
      local_158.opt.use_sgemm_convolution = local_d0.use_sgemm_convolution;
      local_158.opt.use_int8_inference = local_d0.use_int8_inference;
      local_158.opt.use_fp16_packed = local_d0.use_fp16_packed;
      local_158.opt.use_fp16_storage = local_d0.use_fp16_storage;
      local_158.opt.use_fp16_arithmetic = local_d0.use_fp16_arithmetic;
      local_158.opt.use_int8_packed = local_d0.use_int8_packed;
      local_158.opt.use_int8_storage = local_d0.use_int8_storage;
      local_158.opt.use_int8_arithmetic = local_d0.use_int8_arithmetic;
      local_158.opt.use_packing_layout = local_d0.use_packing_layout;
      local_158.opt.use_bf16_storage = local_d0.use_bf16_storage;
      local_158.opt.flush_denormals = local_d0.flush_denormals;
      local_158.opt.use_local_pool_allocator = local_d0.use_local_pool_allocator;
      local_158.opt.use_reserved_1 = local_d0.use_reserved_1;
      local_158.opt.use_reserved_2 = local_d0.use_reserved_2;
      local_158.opt.use_reserved_3 = local_d0.use_reserved_3;
      local_158.opt.use_reserved_4 = local_d0.use_reserved_4;
      local_158.opt.use_reserved_5 = local_d0.use_reserved_5;
      local_158.opt.use_reserved_6 = local_d0.use_reserved_6;
      local_158.opt.use_reserved_7 = local_d0.use_reserved_7;
      local_158.opt.use_reserved_8 = local_d0.use_reserved_8;
      local_158.opt.use_reserved_9 = local_d0.use_reserved_9;
      local_158.opt.use_reserved_10 = local_d0.use_reserved_10;
      local_158.opt.use_reserved_11 = local_d0.use_reserved_11;
      local_158.opt.use_shader_pack8 = local_d0.use_shader_pack8;
      local_158.opt.use_subgroup_basic = local_d0.use_subgroup_basic;
      local_158.opt.use_subgroup_vote = local_d0.use_subgroup_vote;
      local_158.opt.use_subgroup_ballot = local_d0.use_subgroup_ballot;
      local_158.opt.use_subgroup_shuffle = local_d0.use_subgroup_shuffle;
      local_158.opt.use_image_storage = local_d0.use_image_storage;
      local_158.opt.use_tensor_storage = local_d0.use_tensor_storage;
      local_158.opt.use_weight_fp16_storage = local_d0.use_weight_fp16_storage;
      local_158.opt.workspace_allocator = local_d0.workspace_allocator;
      local_158.opt.blob_allocator = local_d0.blob_allocator;
      ncnn::Net::load_param(&local_158,"p2pnet.param");
      ncnn::Net::load_model(&local_158,"p2pnet.bin");
      iVar20 = (int)local_90._8_8_;
      iVar13 = SUB84(local_90._8_8_,4);
      local_e8 = CONCAT44(iVar20,iVar13);
      uStack_e0 = 0;
      local_f8 = (iVar13 / 0x80) * 0x80;
      iStack_f4 = (iVar20 / 0x80) * 0x80;
      iStack_f0 = 0;
      iStack_ec = 0;
      ncnn::Mat::from_pixels_resize
                (&local_1c8,local_80,0x10002,iVar13,iVar20,local_f8,iStack_f4,(Allocator *)0x0);
      local_178 = (undefined1  [16])0x0;
      local_168 = (pointer)0x0;
      local_178._0_8_ = operator_new(4);
      local_168 = (pointer)(local_178._0_8_ + 4);
      *(undefined4 *)local_178._0_8_ = 3;
      local_178._8_8_ = local_168;
      local_348 = (undefined1  [16])0x0;
      local_338._0_1_ = false;
      local_338._1_1_ = false;
      local_338._2_1_ = false;
      local_338._3_1_ = false;
      local_338._4_1_ = false;
      local_338._5_1_ = false;
      local_338._6_1_ = false;
      local_338._7_1_ = false;
      std::vector<int,_std::allocator<int>_>::vector
                (&local_3e0,(vector<int,_std::allocator<int>_> *)local_178);
      local_308 = (pair<int,_int> *)0x0;
      local_318 = (undefined1  [16])0x0;
      local_368 = (int *)0x0;
      _local_378 = (undefined1  [16])0x0;
      if (local_3e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish !=
          local_3e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start) {
        local_3e8 = (double)local_1c8.h;
        local_1d0 = (double)local_1c8.w;
        uVar19 = 0;
        do {
          dVar24 = ldexp(1.0,local_3e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start[uVar19]);
          local_3f8._0_4_ = SUB84(dVar24,0);
          local_3f8._4_4_ = (float)((ulong)dVar24 >> 0x20);
          dVar24 = ldexp(1.0,local_3e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start[uVar19]);
          dVar24 = floor(((double)CONCAT44(local_3f8._4_4_,(float)local_3f8) + local_3e8 + -1.0) /
                         dVar24);
          local_3f8._0_4_ = SUB84(dVar24,0);
          local_3f8._4_4_ = (float)((ulong)dVar24 >> 0x20);
          local_328 = ldexp(1.0,local_3e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start[uVar19]);
          dVar24 = ldexp(1.0,local_3e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start[uVar19]);
          iVar20 = (int)(double)CONCAT44(local_3f8._4_4_,(float)local_3f8);
          dVar24 = floor((local_328 + local_1d0 + -1.0) / dVar24);
          pVar7.first = (int)dVar24;
          pVar7.second = iVar20;
          local_3c8.data._4_4_ = iVar20;
          if ((pair<int,_int> *)local_318._8_8_ == local_308) {
            local_3c8.data._0_4_ = pVar7.first;
            std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
            _M_realloc_insert<std::pair<int,int>>
                      ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)local_318,
                       (iterator)local_318._8_8_,(pair<int,_int> *)&local_3c8);
          }
          else {
            *(pair<int,_int> *)local_318._8_8_ = pVar7;
            local_318._8_8_ = (pair<int,_int> *)(local_318._8_8_ + 8);
            local_3c8.data._0_4_ = pVar7.first;
          }
          dVar24 = ldexp(1.0,local_3e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start[uVar19]);
          local_3c8.data._0_4_ = (int)dVar24;
          if (iStack_370._M_current == local_368) {
            std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                      ((vector<int,_std::allocator<int>_> *)local_378,iStack_370,(int *)&local_3c8);
          }
          else {
            *iStack_370._M_current = (int)local_3c8.data;
            iStack_370._M_current = iStack_370._M_current + 1;
          }
          uVar19 = uVar19 + 1;
        } while (uVar19 < (ulong)((long)local_3e0.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_finish -
                                  (long)local_3e0.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_start >> 2));
      }
      if (local_348._8_8_ != local_348._0_8_) {
        local_348._8_8_ = local_348._0_8_;
      }
      if (local_3e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish !=
          local_3e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start) {
        dVar24 = 0.0;
        do {
          local_218 = (undefined1  [16])0x0;
          local_208 = (pointer)0x0;
          local_3e8 = dVar24;
          dVar24 = ldexp(1.0,local_3e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start[(long)dVar24]);
          local_3c8.data._0_4_ = 0;
          local_3c8.data._4_4_ = 0;
          local_3c8.refcount = (int *)0x0;
          local_3c8.elemsize = 0;
          local_2a8._16_8_ = (float *)0x0;
          local_2a8._0_8_ = (void *)0x0;
          local_2a8._8_4_ = 0;
          local_2a8._12_4_ = 0;
          local_3f8 = (double)((float)(int)dVar24 * 0.5);
          local_328 = -(double)((int)dVar24 / 2);
          uStack_320._0_1_ = false;
          uStack_320._1_1_ = false;
          uStack_320._2_1_ = false;
          uStack_320._3_1_ = false;
          uStack_320._4_1_ = false;
          uStack_320._5_1_ = false;
          uStack_320._6_1_ = false;
          uStack_320._7_1_ = true;
          iVar20 = 1;
          do {
            local_2f8.data._0_4_ = (float)(((double)iVar20 + -0.5) * local_3f8 + local_328);
            if (local_3c8.refcount == (int *)local_3c8.elemsize) {
              std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                        ((vector<float,std::allocator<float>> *)&local_3c8,
                         (iterator)local_3c8.refcount,(float *)&local_2f8);
            }
            else {
              *local_3c8.refcount = (int)local_2f8.data._0_4_;
              local_3c8.refcount = (int *)((float *)local_3c8.refcount + 1);
            }
            iVar20 = iVar20 + 1;
          } while (iVar20 != 3);
          iVar20 = 1;
          do {
            local_2f8.data._0_4_ = (float)(((double)iVar20 + -0.5) * local_3f8 + local_328);
            if (local_2a8._8_8_ == local_2a8._16_8_) {
              std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                        ((vector<float,std::allocator<float>> *)local_2a8,(iterator)local_2a8._8_8_,
                         (float *)&local_2f8);
            }
            else {
              *(float *)local_2a8._8_8_ = local_2f8.data._0_4_;
              local_2a8._8_8_ = local_2a8._8_8_ + 4;
            }
            iVar20 = iVar20 + 1;
          } while (iVar20 != 3);
          puVar8 = (undefined8 *)operator_new(0x10);
          *puVar8 = 0;
          puVar8[1] = 0;
          puVar9 = (undefined8 *)operator_new(0x10);
          *puVar9 = 0;
          puVar9[1] = 0;
          puVar10 = puVar8;
          lVar11 = 0;
          do {
            lVar15 = 0;
            do {
              *(undefined4 *)((long)puVar10 + lVar15 * 4) =
                   *(undefined4 *)(CONCAT44(local_3c8.data._4_4_,(int)local_3c8.data) + lVar15 * 4);
              lVar15 = lVar15 + 1;
            } while (lVar15 == 1);
            puVar10 = puVar10 + 1;
            bVar23 = lVar11 == 0;
            lVar11 = lVar11 + 1;
          } while (bVar23);
          puVar10 = puVar9;
          lVar11 = 0;
          do {
            lVar15 = 0;
            do {
              *(undefined4 *)((long)puVar10 + lVar15 * 4) =
                   *(undefined4 *)(local_2a8._0_8_ + lVar11 * 4);
              lVar15 = lVar15 + 1;
            } while (lVar15 == 1);
            puVar10 = puVar10 + 1;
            bVar23 = lVar11 == 0;
            lVar11 = lVar11 + 1;
          } while (bVar23);
          local_2f8.data._0_4_ = 0.0;
          std::vector<float,_std::allocator<float>_>::resize
                    ((vector<float,_std::allocator<float>_> *)local_218,8,
                     (value_type_conflict1 *)&local_2f8);
          lVar11 = 0;
          do {
            fVar1 = *(float *)((long)puVar9 + lVar11 * 4);
            *(float *)(local_218._0_8_ + lVar11 * 2 * 4) = *(float *)((long)puVar8 + lVar11 * 4);
            *(float *)(local_218._0_8_ + (lVar11 * 2 + 1) * 4) = fVar1;
            lVar11 = lVar11 + 1;
          } while (lVar11 != 4);
          operator_delete(puVar9);
          operator_delete(puVar8);
          if ((void *)local_2a8._0_8_ != (void *)0x0) {
            operator_delete((void *)local_2a8._0_8_);
          }
          if ((void *)CONCAT44(local_3c8.data._4_4_,(int)local_3c8.data) != (void *)0x0) {
            operator_delete((void *)CONCAT44(local_3c8.data._4_4_,(int)local_3c8.data));
          }
          local_238.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_238.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_238.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          uVar21 = *(uint *)((Option **)local_318._0_8_ + (long)local_3e8);
          iVar20 = *(int *)((long)(Option **)local_318._0_8_ + (long)local_3e8 * 8 + 4);
          lVar11 = (long)iVar20;
          iVar13 = *(int *)((long)local_378 + (long)local_3e8 * 4);
          std::vector<float,_std::allocator<float>_>::vector
                    (&local_200,(vector<float,_std::allocator<float>_> *)local_218);
          uVar19 = (ulong)uVar21;
          local_3c8.data._0_4_ = 0;
          local_3c8.data._4_4_ = 0;
          local_3c8.refcount = (int *)0x0;
          local_3c8.elemsize = 0;
          local_2a8._16_8_ = (float *)0x0;
          local_2a8._0_8_ = (void *)0x0;
          local_2a8._8_4_ = 0;
          local_2a8._12_4_ = 0;
          local_3f8 = (double)iVar13;
          if (0 < (int)uVar21) {
            uVar12 = 0;
            local_3c8.refcount = (int *)(float *)0x0;
            do {
              local_2f8.data._0_4_ = (float)(((double)(int)uVar12 + 0.5) * local_3f8);
              if (local_3c8.refcount == (int *)local_3c8.elemsize) {
                std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                          ((vector<float,std::allocator<float>> *)&local_3c8,
                           (iterator)local_3c8.refcount,(float *)&local_2f8);
              }
              else {
                *local_3c8.refcount = (int)local_2f8.data._0_4_;
                local_3c8.refcount = (int *)((float *)local_3c8.refcount + 1);
              }
              uVar12 = uVar12 + 1;
            } while (uVar21 != uVar12);
          }
          if (0 < iVar20) {
            iVar13 = 0;
            do {
              local_2f8.data._0_4_ = (float)(((double)iVar13 + 0.5) * local_3f8);
              if (local_2a8._8_8_ == local_2a8._16_8_) {
                std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                          ((vector<float,std::allocator<float>> *)local_2a8,
                           (iterator)local_2a8._8_8_,(float *)&local_2f8);
              }
              else {
                *(float *)local_2a8._8_8_ = local_2f8.data._0_4_;
                local_2a8._8_8_ = local_2a8._8_8_ + 4;
              }
              iVar13 = iVar13 + 1;
            } while (iVar20 != iVar13);
          }
          __n = lVar11 * (int)uVar21;
          local_360._0_4_ = 0;
          std::vector<float,_std::allocator<float>_>::vector
                    ((vector<float,_std::allocator<float>_> *)&local_2f8,__n,
                     (value_type_conflict1 *)local_360,(allocator_type *)&local_1e8);
          local_1e8 = (void *)((ulong)local_1e8 & 0xffffffff00000000);
          std::vector<float,_std::allocator<float>_>::vector
                    ((vector<float,_std::allocator<float>_> *)local_360,__n,
                     (value_type_conflict1 *)&local_1e8,(allocator_type *)&local_400);
          if (0 < iVar20) {
            lVar15 = CONCAT44(local_2f8.data._4_4_,local_2f8.data._0_4_);
            lVar16 = 0;
            do {
              if (0 < (int)uVar21) {
                uVar17 = 0;
                do {
                  *(undefined4 *)(lVar15 + uVar17 * 4) =
                       *(undefined4 *)
                        (CONCAT44(local_3c8.data._4_4_,(int)local_3c8.data) + uVar17 * 4);
                  uVar17 = uVar17 + 1;
                } while (uVar19 != uVar17);
              }
              lVar16 = lVar16 + 1;
              lVar15 = lVar15 + uVar19 * 4;
            } while (lVar16 != lVar11);
            lVar15 = CONCAT44(local_360._4_4_,local_360._0_4_);
            lVar16 = 0;
            do {
              if (0 < (int)uVar21) {
                uVar17 = 0;
                do {
                  *(undefined4 *)(lVar15 + uVar17 * 4) =
                       *(undefined4 *)(local_2a8._0_8_ + lVar16 * 4);
                  uVar17 = uVar17 + 1;
                } while (uVar19 != uVar17);
              }
              lVar16 = lVar16 + 1;
              lVar15 = lVar15 + uVar19 * 4;
            } while (lVar16 != lVar11);
          }
          local_400 = 0.0;
          std::vector<float,_std::allocator<float>_>::vector
                    ((vector<float,_std::allocator<float>_> *)&local_1e8,__n * 2,&local_400,
                     &local_3f9);
          uVar21 = uVar21 * iVar20;
          if (0 < (int)uVar21) {
            uVar19 = 0;
            do {
              *(undefined4 *)((long)local_1e8 + uVar19 * 8) =
                   *(undefined4 *)(CONCAT44(local_2f8.data._4_4_,local_2f8.data._0_4_) + uVar19 * 4)
              ;
              *(undefined4 *)((long)local_1e8 + uVar19 * 8 + 4) =
                   *(undefined4 *)(CONCAT44(local_360._4_4_,local_360._0_4_) + uVar19 * 4);
              uVar19 = uVar19 + 1;
            } while (uVar21 != uVar19);
          }
          local_400 = 0.0;
          std::vector<float,_std::allocator<float>_>::resize
                    (&local_238,
                     __n * ((long)local_200.super__Vector_base<float,_std::allocator<float>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                            (long)local_200.super__Vector_base<float,_std::allocator<float>_>.
                                  _M_impl.super__Vector_impl_data._M_start >> 2) &
                     0x7fffffffffffffff,&local_400);
          if (0 < (int)uVar21) {
            uVar19 = (long)local_200.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                     (long)local_200.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_start >> 2;
            uVar17 = 0;
            uVar18 = 0;
            do {
              if (1 < uVar19) {
                uVar14 = 0;
                uVar22 = uVar17;
                do {
                  fVar1 = local_200.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start[uVar14 * 2 + 1];
                  fVar2 = *(float *)((long)local_1e8 + (uVar18 * 2 + 1) * 4);
                  local_238.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_start[(uVar17 & 0xfffffffffffffffe) + uVar14 * 2] =
                       local_200.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar14 * 2] +
                       *(float *)((long)local_1e8 + uVar18 * 8);
                  *(float *)((long)local_238.super__Vector_base<float,_std::allocator<float>_>.
                                   _M_impl.super__Vector_impl_data._M_start + (uVar22 * 4 | 4)) =
                       fVar1 + fVar2;
                  uVar14 = uVar14 + 1;
                  uVar22 = uVar22 + 2;
                } while (uVar19 >> 1 != uVar14);
              }
              uVar18 = uVar18 + 1;
              uVar17 = uVar17 + uVar19;
            } while (uVar18 != uVar21);
          }
          if (local_1e8 != (void *)0x0) {
            operator_delete(local_1e8);
          }
          if ((void *)CONCAT44(local_360._4_4_,local_360._0_4_) != (void *)0x0) {
            operator_delete((void *)CONCAT44(local_360._4_4_,local_360._0_4_));
          }
          if ((void *)CONCAT44(local_2f8.data._4_4_,local_2f8.data._0_4_) != (void *)0x0) {
            operator_delete((void *)CONCAT44(local_2f8.data._4_4_,local_2f8.data._0_4_));
          }
          if ((void *)local_2a8._0_8_ != (void *)0x0) {
            operator_delete((void *)local_2a8._0_8_);
          }
          if ((void *)CONCAT44(local_3c8.data._4_4_,(int)local_3c8.data) != (void *)0x0) {
            operator_delete((void *)CONCAT44(local_3c8.data._4_4_,(int)local_3c8.data));
          }
          if (local_200.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_200.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start);
          }
          std::vector<float,std::allocator<float>>::
          _M_range_insert<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>>
                    ((vector<float,std::allocator<float>> *)local_348,local_348._8_8_,
                     local_238.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     local_238.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_finish);
          if (local_238.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_238.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start);
          }
          if ((pointer)local_218._0_8_ != (pointer)0x0) {
            operator_delete((void *)local_218._0_8_);
          }
          dVar24 = (double)((long)local_3e8 + 1);
        } while ((ulong)dVar24 <
                 (ulong)((long)local_3e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_finish -
                         (long)local_3e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start >> 2));
      }
      if ((Point)local_378 != (Point)0x0) {
        operator_delete((void *)local_378);
      }
      if ((NetPrivate *)local_318._0_8_ != (NetPrivate *)0x0) {
        operator_delete((void *)local_318._0_8_);
      }
      if (local_3e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_3e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      local_3c8.data._0_4_ = local_348._0_4_;
      local_3c8.data._4_4_ = local_348._4_4_;
      local_3c8.refcount._0_4_ = 0;
      local_3c8.refcount._4_4_ = 0;
      local_3c8.elemsize = 4;
      local_3c8.elempack = 1;
      local_3c8.allocator = (Allocator *)0x0;
      local_3c8.dims = 2;
      local_3c8.w = 2;
      local_3c8.h = (int)((ulong)(local_348._8_8_ - local_348._0_8_) >> 3);
      local_3c8.d = 1;
      local_3c8.c = 1;
      local_3c8.cstep = (long)local_3c8.h * 2;
      ncnn::Net::create_extractor((Net *)local_360);
      local_1e8 = (void *)0x42e88f5c42f7599a;
      local_1e0 = 0x42cf0f5c;
      local_318._8_4_ = 0x3c8ec7a9;
      local_318._0_8_ = 0x3c8f5c293c8c4934;
      ncnn::Mat::substract_mean_normalize(&local_1c8,(float *)&local_1e8,(float *)local_318);
      ncnn::Extractor::input((Extractor *)local_360,"input",&local_1c8);
      ncnn::Extractor::input((Extractor *)local_360,"anchor",&local_3c8);
      local_268 = 0;
      local_2a8._0_8_ = (void *)0x0;
      local_2a8._8_4_ = 0;
      local_2a8._12_4_ = 0;
      local_2a8._16_8_ = (float *)0x0;
      local_2a8._24_4_ = 0;
      local_2a8._32_8_ = (Allocator *)0x0;
      local_2a8._40_4_ = 0;
      local_2a8._44_4_ = 0;
      local_2a8._48_12_ = SUB1612((undefined1  [16])0x0,4);
      local_2f8.cstep = 0;
      local_2f8.data._0_4_ = 0.0;
      local_2f8.data._4_4_ = 0;
      local_2f8.refcount._0_4_ = 0;
      local_2f8.refcount._4_4_ = 0;
      local_2f8.elemsize = 0;
      local_2f8.elempack = 0;
      local_2f8.allocator = (Allocator *)0x0;
      local_2f8.dims = 0;
      local_2f8.w = 0;
      local_2f8.h = 0;
      local_2f8.d = 0;
      local_2f8.c = 0;
      ncnn::Extractor::extract((Extractor *)local_360,"pred_scores",(Mat *)local_2a8,0);
      ncnn::Extractor::extract((Extractor *)local_360,"pred_points",&local_2f8,0);
      if (0 < local_2f8.h) {
        local_3f8._0_4_ = (float)local_f8;
        local_3f8._4_4_ = (float)iStack_f4;
        fStack_3f0 = (float)iStack_f0;
        fStack_3ec = (float)iStack_ec;
        local_328 = (double)CONCAT44((float)local_e8._4_4_,(float)(int)local_e8);
        uStack_320._4_4_ = (float)uStack_e0._4_4_;
        uStack_320._0_4_ = (float)(int)uStack_e0;
        lVar11 = 0;
        do {
          auVar5 = _local_378;
          auVar25._8_8_ = 0;
          auVar25._0_8_ =
               *(ulong *)(CONCAT44(local_2f8.data._4_4_,local_2f8.data._0_4_) +
                         local_2f8.w * lVar11 * local_2f8.elemsize);
          auVar26._4_4_ = local_3f8._4_4_;
          auVar26._0_4_ = (float)local_3f8;
          auVar26._8_4_ = fStack_3f0;
          auVar26._12_4_ = fStack_3ec;
          auVar26 = divps(auVar25,auVar26);
          local_378._4_4_ = (int)(auVar26._4_4_ * local_328._4_4_);
          local_378._0_4_ = (int)(auVar26._0_4_ * (float)local_328);
          iStack_370._M_current._4_4_ = auVar5._12_4_;
          iStack_370._M_current._0_4_ =
               *(float *)(local_2a8._0_8_ + (int)local_2a8._44_4_ * lVar11 * local_2a8._16_8_ + 4);
          std::vector<CrowdPoint,_std::allocator<CrowdPoint>_>::push_back
                    ((vector<CrowdPoint,_std::allocator<CrowdPoint>_> *)local_258,
                     (value_type *)local_378);
          lVar11 = lVar11 + 1;
        } while (lVar11 < local_2f8.h);
      }
      piVar4 = (int *)CONCAT44(local_2f8.refcount._4_4_,local_2f8.refcount._0_4_);
      if (piVar4 != (int *)0x0) {
        LOCK();
        *piVar4 = *piVar4 + -1;
        UNLOCK();
        if (*piVar4 == 0) {
          if (local_2f8.allocator == (Allocator *)0x0) {
            if ((void *)CONCAT44(local_2f8.data._4_4_,local_2f8.data._0_4_) != (void *)0x0) {
              free((void *)CONCAT44(local_2f8.data._4_4_,local_2f8.data._0_4_));
            }
          }
          else {
            (*(local_2f8.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      piVar4 = (int *)CONCAT44(local_2a8._12_4_,local_2a8._8_4_);
      if (piVar4 != (int *)0x0) {
        LOCK();
        *piVar4 = *piVar4 + -1;
        UNLOCK();
        if (*piVar4 == 0) {
          if ((Allocator *)local_2a8._32_8_ == (Allocator *)0x0) {
            if ((void *)local_2a8._0_8_ != (void *)0x0) {
              free((void *)local_2a8._0_8_);
            }
          }
          else {
            (*(*(_func_int ***)local_2a8._32_8_)[3])();
          }
        }
      }
      ncnn::Extractor::~Extractor((Extractor *)local_360);
      piVar4 = (int *)CONCAT44(local_3c8.refcount._4_4_,local_3c8.refcount._0_4_);
      if (piVar4 != (int *)0x0) {
        LOCK();
        *piVar4 = *piVar4 + -1;
        UNLOCK();
        if (*piVar4 == 0) {
          if (local_3c8.allocator == (Allocator *)0x0) {
            if ((void *)CONCAT44(local_3c8.data._4_4_,(int)local_3c8.data) != (void *)0x0) {
              free((void *)CONCAT44(local_3c8.data._4_4_,(int)local_3c8.data));
            }
          }
          else {
            (*(local_3c8.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      local_3c8.cstep = 0;
      local_3c8.data._0_4_ = 0;
      local_3c8.data._4_4_ = 0;
      local_3c8.refcount._0_4_ = 0;
      local_3c8.refcount._4_4_ = 0;
      local_3c8.elemsize = 0;
      local_3c8.elempack = 0;
      local_3c8.dims = 0;
      local_3c8.w = 0;
      local_3c8.h = 0;
      local_3c8.d = 0;
      local_3c8.c = 0;
      if ((Allocator *)local_348._0_8_ != (Allocator *)0x0) {
        operator_delete((void *)local_348._0_8_);
      }
      if ((pointer)local_178._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_178._0_8_);
      }
      if (local_1c8.refcount != (int *)0x0) {
        LOCK();
        *local_1c8.refcount = *local_1c8.refcount + -1;
        UNLOCK();
        if (*local_1c8.refcount == 0) {
          if (local_1c8.allocator == (Allocator *)0x0) {
            if ((size_t *)local_1c8.data != (size_t *)0x0) {
              free(local_1c8.data);
            }
          }
          else {
            (*(local_1c8.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      ncnn::Net::~Net(&local_158);
      cv::Mat::clone();
      if (local_258._8_8_ != local_258._0_8_) {
        lVar11 = 8;
        uVar19 = 0;
        do {
          if (0.5 < *(float *)((long)&(((pointer)local_258._0_8_)->pt).x + lVar11)) {
            local_3c8.elemsize = 0;
            local_3c8.data._0_4_ = 0x3010000;
            local_3c8.refcount = (int *)&local_158;
            local_2a8._0_8_ = *(undefined8 *)(local_258._0_8_ + lVar11 + -8);
            local_1c8.data = (void *)0x0;
            local_1c8.refcount = (int *)0x0;
            local_1c8.elemsize = 0x406fe00000000000;
            local_1c8.elempack = 0;
            local_1c8._28_4_ = 0;
            cv::circle(&local_3c8,local_2a8,4,&local_1c8,0xffffffff,8,0);
          }
          uVar19 = uVar19 + 1;
          uVar17 = ((long)(local_258._8_8_ - local_258._0_8_) >> 2) * -0x5555555555555555;
          lVar11 = lVar11 + 0xc;
        } while (uVar19 <= uVar17 && uVar17 - uVar19 != 0);
      }
      local_1c8.elemsize = CONCAT26(local_1c8.elemsize._6_2_,0x6567616d69);
      local_1c8.refcount = (int *)0x5;
      local_3c8.elemsize = 0;
      local_3c8.data._0_4_ = 0x1010000;
      local_3c8.refcount = (int *)&local_158;
      local_1c8.data = &local_1c8.elemsize;
      cv::imshow((string *)&local_1c8,(_InputArray *)&local_3c8);
      if ((size_t *)local_1c8.data != &local_1c8.elemsize) {
        operator_delete(local_1c8.data);
      }
      cv::waitKey(0);
      cv::Mat::~Mat((Mat *)&local_158);
      if ((pointer)local_258._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_258._0_8_);
      }
      iVar20 = 0;
    }
    else {
      fprintf(_stderr,"cv::imread %s failed\n",pcVar3);
      iVar20 = -1;
    }
    cv::Mat::~Mat((Mat *)local_90);
  }
  else {
    main_cold_1();
    iVar20 = -1;
  }
  return iVar20;
}

Assistant:

int main(int argc, char** argv)
{
    if (argc != 2)
    {
        fprintf(stderr, "Usage: %s [imagepath]\n", argv[0]);
        return -1;
    }

    const char* imagepath = argv[1];

    cv::Mat bgr = cv::imread(imagepath, 1);
    if (bgr.empty())
    {
        fprintf(stderr, "cv::imread %s failed\n", imagepath);
        return -1;
    }

    std::vector<CrowdPoint> crowd_points;
    detect_crowd(bgr, crowd_points);
    draw_result(bgr, crowd_points);

    return 0;
}